

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void sort_column(Matrix<double> *mat,uint col,uint beg_row,uint end_row)

{
  long lVar1;
  ulong uVar2;
  __normal_iterator<std::pair<unsigned_int,_double>_*,_std::vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>_>
  __i;
  pointer ppVar3;
  vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_> vps;
  _Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
  local_40;
  
  get_vps((vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
           *)&local_40,mat,col,beg_row,end_row);
  if (local_40._M_impl.super__Vector_impl_data._M_start !=
      local_40._M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
            (long)local_40._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,double>*,std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<sort_column(Matrix<double>&,unsigned_int,unsigned_int,unsigned_int)::__0>>
              (local_40._M_impl.super__Vector_impl_data._M_start,
               local_40._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)local_40._M_impl.super__Vector_impl_data._M_finish -
        (long)local_40._M_impl.super__Vector_impl_data._M_start < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,double>*,std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<sort_column(Matrix<double>&,unsigned_int,unsigned_int,unsigned_int)::__0>>
                (local_40._M_impl.super__Vector_impl_data._M_start,
                 local_40._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      ppVar3 = local_40._M_impl.super__Vector_impl_data._M_start + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,double>*,std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<sort_column(Matrix<double>&,unsigned_int,unsigned_int,unsigned_int)::__0>>
                (local_40._M_impl.super__Vector_impl_data._M_start,ppVar3);
      for (; ppVar3 != local_40._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,double>*,std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>>,__gnu_cxx::__ops::_Val_comp_iter<sort_column(Matrix<double>&,unsigned_int,unsigned_int,unsigned_int)::__0>>
                  (ppVar3);
      }
    }
  }
  modify_vps(mat,(vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                  *)&local_40,beg_row);
  std::
  _Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>::
  ~_Vector_base(&local_40);
  return;
}

Assistant:

void sort_column(Matrix_d& mat, unsigned col, unsigned beg_row, unsigned end_row){
    std::vector<std::pair<unsigned, double>> vps=get_vps(mat, col, beg_row, end_row);
    
    std::sort(vps.begin(), vps.end(), 
        [](const std::pair<unsigned, double>& vp1, const std::pair<unsigned, double>& vp2)->bool{
            return vp1.second<vp2.second;
        }
    );

    modify_vps(mat, vps, beg_row);
}